

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sparse_array.cpp
# Opt level: O0

void __thiscall
SparseArray_IteratorInitializationTooManyValues_Test<unsigned_short>::
~SparseArray_IteratorInitializationTooManyValues_Test
          (SparseArray_IteratorInitializationTooManyValues_Test<unsigned_short> *this)

{
  SparseArray_IteratorInitializationTooManyValues_Test<unsigned_short> *this_local;
  
  ~SparseArray_IteratorInitializationTooManyValues_Test(this);
  ::operator_delete(this,0x10);
  return;
}

Assistant:

TYPED_TEST (SparseArray, IteratorInitializationTooManyValues) {
    std::vector<std::size_t> i1{3, 5};
    std::vector<int> v1{3, 5, 7};

    auto arrp = sparse_array<int, TypeParam>::make_unique (std::begin (i1), std::end (i1),
                                                           std::begin (v1), std::end (v1));
    auto & arr = *arrp;

    EXPECT_FALSE (arr.has_index (0));
    EXPECT_FALSE (arr.has_index (1));
    EXPECT_FALSE (arr.has_index (2));
    EXPECT_EQ (arr[3], 3);
    EXPECT_FALSE (arr.has_index (4));
    EXPECT_EQ (arr[5], 5);
}